

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

double __thiscall Clasp::ClaspFacade::SolveData::BoundArray::_at(BoundArray *this,uint32_t idx)

{
  long lVar1;
  wsum_t wVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar4 = (this->data->en).ptr_ & 0xfffffffffffffffe;
  uVar3 = 0;
  if ((uVar4 != 0) && (lVar1 = *(long *)(uVar4 + 8), uVar3 = 0, lVar1 != 0)) {
    uVar3 = *(uint *)(lVar1 + 8);
  }
  if (idx < uVar3) {
    wVar2 = _bound(this->data,this->type,idx);
    if (wVar2 == 0x7fffffffffffffff) {
      dVar5 = INFINITY;
    }
    else {
      dVar5 = (double)wVar2;
    }
    return dVar5;
  }
  Potassco::fail(-2,"double Clasp::ClaspFacade::SolveData::BoundArray::_at(uint32_t) const",0x1c6,
                 "idx < size()","expired key",0);
}

Assistant:

double _at(uint32_t idx) const {
			POTASSCO_REQUIRE(idx < size(), "expired key");
			const wsum_t bound = data->_bound(type, idx);
			return bound != SharedMinimizeData::maxBound()
				? static_cast<double>(bound)
				: std::numeric_limits<double>::infinity();
		}